

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidyParseBuffer(TidyDoc tdoc,TidyBuffer *inbuf)

{
  int iVar1;
  StreamIn *in;
  TidyDocImpl *doc;
  
  if (inbuf != (TidyBuffer *)0x0) {
    in = prvTidyBufferInput((TidyDocImpl *)tdoc,inbuf,tdoc[0x60]._opaque);
    iVar1 = prvTidyDocParseStream((TidyDocImpl *)tdoc,in);
    prvTidyfreeStreamIn(in);
    return iVar1;
  }
  return -0x16;
}

Assistant:

int   tidyDocParseBuffer( TidyDocImpl* doc, TidyBuffer* inbuf )
{
    int status = -EINVAL;
    if ( inbuf )
    {
        StreamIn* in = TY_(BufferInput)( doc, inbuf, cfg( doc, TidyInCharEncoding ));
        status = TY_(DocParseStream)( doc, in );
        TY_(freeStreamIn)(in);
    }
    return status;
}